

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O3

void Llb_NonlinFree(Llb_Mgr_t *p)

{
  int iVar1;
  long lVar2;
  
  iVar1 = p->nVars;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (p->pVars[lVar2] != (Llb_Var_t *)0x0) {
        Llb_NonlinRemoveVar(p,p->pVars[lVar2]);
        iVar1 = p->nVars;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  iVar1 = p->iPartFree;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (p->pParts[lVar2] != (Llb_Prt_t *)0x0) {
        Llb_NonlinRemovePart(p,p->pParts[lVar2]);
        iVar1 = p->iPartFree;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (p->pVars != (Llb_Var_t **)0x0) {
    free(p->pVars);
    p->pVars = (Llb_Var_t **)0x0;
  }
  if (p->pParts != (Llb_Prt_t **)0x0) {
    free(p->pParts);
    p->pParts = (Llb_Prt_t **)0x0;
  }
  if (p->pSupp != (int *)0x0) {
    free(p->pSupp);
  }
  free(p);
  return;
}

Assistant:

void Llb_NonlinFree( Llb_Mgr_t * p )
{
    Llb_Prt_t * pPart;
    Llb_Var_t * pVar;
    int i;
    Llb_MgrForEachVar( p, pVar, i )
        Llb_NonlinRemoveVar( p, pVar );
    Llb_MgrForEachPart( p, pPart, i )
        Llb_NonlinRemovePart( p, pPart );
    ABC_FREE( p->pVars );
    ABC_FREE( p->pParts );
    ABC_FREE( p->pSupp );
    ABC_FREE( p );
}